

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HPresolve.cpp
# Opt level: O1

bool __thiscall presolve::HPresolve::isImpliedInteger(HPresolve *this,HighsInt col)

{
  vector<double,_std::allocator<double>_> *pvVar1;
  double *pdVar2;
  int iVar3;
  int iVar4;
  pointer piVar5;
  HighsLp *pHVar6;
  byte bVar7;
  bool bVar8;
  char cVar9;
  long lVar10;
  vector<double,_std::allocator<double>_> *pvVar11;
  vector<double,_std::allocator<double>_> *pvVar12;
  long lVar13;
  double *pdVar14;
  int *piVar15;
  bool bVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  
  lVar13 = (long)(this->colhead).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start[col];
  bVar16 = lVar13 == -1;
  if (bVar16) {
    bVar7 = 1;
  }
  else {
    piVar5 = (this->Anext).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar14 = (this->Avalue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start + lVar13;
    piVar15 = (this->Arow).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start + lVar13;
    bVar7 = 1;
    do {
      iVar3 = *piVar15;
      iVar4 = (this->rowsize).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start[iVar3];
      cVar9 = '\x03';
      if ((iVar4 < 2) ||
         ((this->rowsizeImplInt).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start[iVar3] +
          (this->rowsizeInteger).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start[iVar3] < iVar4 + -1)) {
        bVar7 = 0;
      }
      else {
        dVar18 = (this->options->super_HighsOptionsStruct).dual_feasibility_tolerance;
        dVar17 = -dVar18;
        pvVar1 = &this->model->row_lower_;
        pvVar12 = &this->model->row_upper_;
        pdVar2 = (this->implRowDualUpper).super__Vector_base<double,_std::allocator<double>_>.
                 _M_impl.super__Vector_impl_data._M_start + iVar3;
        pvVar11 = pvVar1;
        if (*pdVar2 <= dVar17 && dVar17 != *pdVar2) {
          pvVar11 = pvVar12;
        }
        if (dVar18 < (this->implRowDualLower).super__Vector_base<double,_std::allocator<double>_>.
                     _M_impl.super__Vector_impl_data._M_start[iVar3]) {
          pvVar12 = pvVar1;
        }
        dVar18 = (pvVar12->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_start[iVar3];
        pdVar2 = (pvVar11->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_start + iVar3;
        cVar9 = '\0';
        if ((dVar18 == *pdVar2) && (!NAN(dVar18) && !NAN(*pdVar2))) {
          dVar18 = *pdVar14;
          dVar19 = (this->model->row_lower_).super__Vector_base<double,_std::allocator<double>_>.
                   _M_impl.super__Vector_impl_data._M_start[iVar3] * (1.0 / dVar18);
          dVar17 = round(dVar19);
          dVar17 = ABS(dVar19 - dVar17);
          if (dVar17 < this->primal_feastol || dVar17 == this->primal_feastol) {
            bVar8 = rowCoefficientsIntegral(this,iVar3,1.0 / dVar18);
            cVar9 = !bVar8 * '\x02' + '\x01';
          }
          else {
            cVar9 = '\x03';
          }
          bVar7 = 0;
        }
      }
      if ((cVar9 != '\x03') && (cVar9 != '\0')) break;
      lVar10 = (long)(int)lVar13;
      lVar13 = (long)piVar5[lVar10];
      piVar15 = piVar15 + (lVar13 - lVar10);
      pdVar14 = pdVar14 + (lVar13 - lVar10);
      bVar16 = lVar13 == -1;
    } while (!bVar16);
  }
  if ((bVar7 & bVar16) == 0) {
    bVar16 = (bool)(bVar16 ^ 1);
  }
  else {
    pHVar6 = this->model;
    dVar18 = (pHVar6->col_lower_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start[col];
    if (((-INFINITY < dVar18) &&
        (dVar17 = round(dVar18),
        pdVar14 = &(this->options->super_HighsOptionsStruct).small_matrix_value,
        *pdVar14 <= ABS(dVar18 - dVar17) && ABS(dVar18 - dVar17) != *pdVar14)) ||
       ((dVar18 = (pHVar6->col_upper_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start[col], dVar18 < INFINITY &&
        (dVar17 = round(dVar18),
        pdVar14 = &(this->options->super_HighsOptionsStruct).small_matrix_value,
        *pdVar14 <= ABS(dVar18 - dVar17) && ABS(dVar18 - dVar17) != *pdVar14)))) {
      bVar16 = false;
    }
    else {
      lVar13 = (long)(this->colhead).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start[col];
      if (lVar13 != -1) {
        piVar5 = (this->Anext).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        pdVar14 = (this->Avalue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start + lVar13;
        piVar15 = (this->Arow).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start + lVar13;
        bVar16 = true;
        do {
          dVar17 = 1.0 / *pdVar14;
          pHVar6 = this->model;
          iVar3 = *piVar15;
          dVar18 = (pHVar6->row_upper_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start[iVar3];
          if (((dVar18 < INFINITY) &&
              (dVar18 = dVar18 * dVar17, dVar19 = round(dVar18), dVar18 = ABS(dVar18 - dVar19),
              this->primal_feastol <= dVar18 && dVar18 != this->primal_feastol)) ||
             ((dVar18 = (pHVar6->row_lower_).super__Vector_base<double,_std::allocator<double>_>.
                        _M_impl.super__Vector_impl_data._M_start[iVar3], -INFINITY < dVar18 &&
              (dVar18 = dVar18 * dVar17, dVar19 = round(dVar18), dVar18 = ABS(dVar18 - dVar19),
              this->primal_feastol <= dVar18 && dVar18 != this->primal_feastol)))) {
            bVar8 = false;
            bVar16 = false;
          }
          else {
            bVar8 = rowCoefficientsIntegral(this,iVar3,dVar17);
            bVar16 = (bool)(bVar16 & bVar8);
          }
          if (bVar8 == false) {
            return bVar16;
          }
          lVar10 = (long)(int)lVar13;
          lVar13 = (long)piVar5[lVar10];
          piVar15 = piVar15 + (lVar13 - lVar10);
          pdVar14 = pdVar14 + (lVar13 - lVar10);
        } while (lVar13 != -1);
      }
      bVar16 = true;
    }
  }
  return bVar16;
}

Assistant:

bool HPresolve::isImpliedInteger(HighsInt col) {
  // check if a continuous variable is implied integer
  assert(model->integrality_[col] == HighsVarType::kContinuous);

  bool runDualDetection = true;

  for (const HighsSliceNonzero& nz : getColumnVector(col)) {
    // if not all other columns are integer, skip row and also do not try the
    // dual detection in the second loop as it must hold for all rows
    if (rowsize[nz.index()] < 2 ||
        rowsizeInteger[nz.index()] + rowsizeImplInt[nz.index()] <
            rowsize[nz.index()] - 1) {
      runDualDetection = false;
      continue;
    }

    double rowLower = isImpliedEquationAtUpper(nz.index())
                          ? model->row_upper_[nz.index()]
                          : model->row_lower_[nz.index()];

    double rowUpper = isImpliedEquationAtLower(nz.index())
                          ? model->row_lower_[nz.index()]
                          : model->row_upper_[nz.index()];

    if (rowUpper == rowLower) {
      // if there is an equation the dual detection does not need to be tried
      runDualDetection = false;
      double scale = 1.0 / nz.value();

      if (fractionality(model->row_lower_[nz.index()] * scale) >
          primal_feastol) {
        continue;
      }

      if (!rowCoefficientsIntegral(nz.index(), scale)) continue;

      return true;
    }
  }

  if (!runDualDetection) return false;

  if ((model->col_lower_[col] != -kHighsInf &&
       fractionality(model->col_lower_[col]) > options->small_matrix_value) ||
      (model->col_upper_[col] != kHighsInf &&
       fractionality(model->col_upper_[col]) > options->small_matrix_value))
    return false;

  for (const HighsSliceNonzero& nz : getColumnVector(col)) {
    double scale = 1.0 / nz.value();
    if (model->row_upper_[nz.index()] != kHighsInf &&
        fractionality(model->row_upper_[nz.index()] * scale) > primal_feastol)
      return false;

    if (model->row_lower_[nz.index()] != -kHighsInf &&
        fractionality(model->row_lower_[nz.index()] * scale) > primal_feastol)
      return false;

    if (!rowCoefficientsIntegral(nz.index(), scale)) return false;
  }

  return true;
}